

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

void Am_Choice_List_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Slot_Flags set_flags;
  Am_Object new_object;
  Am_Object ref_object;
  Am_Object local_60;
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Choice_How_Set how_set;
  Am_Input_Char ic;
  Am_Value_List new_value;
  
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set(&how_set,pAVar2);
  pAVar2 = Am_Object::Get(inter,0x169,3);
  Am_Value::Am_Value(&old_value,pAVar2);
  Am_Value_List::Am_Value_List(&old_value_list);
  bVar1 = Am_Value_List::Test(&old_value);
  if (bVar1) {
    Am_Value_List::operator=(&old_value_list,&old_value);
  }
  else if (old_value.type == 0xa001) {
    Am_Value_List::Add(&old_value_list,&old_value,Am_TAIL,true);
  }
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&new_object,pAVar2);
  if (how_set.value == Am_CHOICE_LIST_TOGGLE.value) {
    pAVar2 = Am_Object::Get(inter,0x12e,0);
    Am_Object::Am_Object(&ref_object,pAVar2);
    pAVar2 = Am_Object::Get(inter,0x11b,0);
    Am_Input_Char::Am_Input_Char(&ic,pAVar2);
    bVar1 = Am_Object::Valid(&ref_object);
    if (bVar1) {
      bVar1 = Am_Object::Valid(&new_object);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(inter,0x1ef,0);
        Am_Object::operator=(&new_object,pAVar2);
      }
    }
    else {
      Am_Object::operator=(&ref_object,&new_object);
    }
    list_final_value((Am_Object *)&new_value,inter,&new_object,(Am_Value_List *)&ref_object,
                     SUB81(&old_value_list,0));
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_value);
    Am_Object::Set(inter,0x169,pAVar3,1);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&ref_object);
    Am_Object::Set(inter,0x16d,pAVar3,1);
    Am_Value_List::~Am_Value_List(&new_value);
    Am_Object::~Am_Object(&ref_object);
    goto LAB_00235bb9;
  }
  set_flags = 1;
  Am_Object::Set(&new_object,0x173,false,1);
  Am_Value_List::Start(&old_value_list);
  if (how_set.value == Am_CHOICE_TOGGLE.value) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
    bVar1 = Am_Value_List::Member(&old_value_list,pAVar3);
    if (!bVar1) goto LAB_00235ab8;
LAB_00235ac5:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
    set_flags = 0;
  }
  else {
LAB_00235ab8:
    if (how_set.value == Am_CHOICE_CLEAR.value) goto LAB_00235ac5;
    bVar1 = Am_Object::Valid(&new_object);
    if (bVar1) {
      Am_Object::Set(&new_object,0x172,true,1);
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
  }
  Am_Object::Set(inter,0x169,pAVar3,set_flags);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
  Am_Object::Set(inter,0x16d,pAVar3,1);
LAB_00235bb9:
  Am_Object::Set(inter,0x16c,&old_value,1);
  Am_Object::Am_Object(&local_60,inter);
  Am_Copy_Values_To_Command(&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&new_object);
  Am_Value_List::~Am_Value_List(&old_value_list);
  Am_Value::~Am_Value(&old_value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Do, (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  Am_Value old_value = inter.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_Value_List old_value_list;
  if (Am_Value_List::Test(old_value))
    old_value_list = old_value;
  else if (old_value.type == Am_OBJECT)
    old_value_list.Add(old_value);
  Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool separate_extend = ic.control;
    if (!ref_object.Valid())
      ref_object = new_object;
    else if (!new_object.Valid())
      new_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);
    // clears interim value and sets new value
    Am_Value_List new_value = list_final_value(inter, new_object, ref_object,
                                               old_value_list, separate_extend);
    inter.Set(Am_VALUE, new_value, Am_OK_IF_NOT_THERE);
    inter.Set(Am_OBJECT_MODIFIED, ref_object, Am_OK_IF_NOT_THERE);
  } else {
    Am_REPORT_SET_SEL_VALUE(false, inter, new_object, false);
    new_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    old_value_list.Start();
    if ((how_set == Am_CHOICE_TOGGLE && old_value_list.Member(new_object)) ||
        how_set == Am_CHOICE_CLEAR)
      inter.Set(Am_VALUE, Am_No_Object); // empty
    else {
      if (new_object.Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_object, true);
        new_object.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
      inter.Set(Am_VALUE, new_object, Am_OK_IF_NOT_THERE);
    }
    inter.Set(Am_OBJECT_MODIFIED, new_object, Am_OK_IF_NOT_THERE);
  }
  inter.Set(Am_OLD_VALUE, old_value, Am_OK_IF_NOT_THERE);
  Am_Copy_Values_To_Command(inter);
}